

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 (*pauVar31) [16];
  int iVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  ulong unaff_R12;
  size_t mask;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  vint4 bi_1;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  vint4 bi;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  vint4 ai;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [64];
  undefined1 auVar74 [32];
  uint uVar76;
  uint uVar77;
  undefined1 auVar75 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_1450;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar56 [32];
  undefined1 auVar60 [32];
  
  pauVar40 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar92 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1370._4_4_ = fVar3;
  local_1370._0_4_ = fVar3;
  local_1370._8_4_ = fVar3;
  local_1370._12_4_ = fVar3;
  auVar67 = ZEXT1664(local_1370);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = fVar68;
  local_1380._0_4_ = fVar68;
  local_1380._8_4_ = fVar68;
  local_1380._12_4_ = fVar68;
  auVar70 = ZEXT1664(local_1380);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar32 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT1664(CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32))));
  local_1390._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1390._8_4_ = -fVar2;
  local_1390._12_4_ = -fVar2;
  auVar75 = ZEXT1664(local_1390);
  local_13a0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar3;
  local_13a0._12_4_ = -fVar3;
  auVar80 = ZEXT1664(local_13a0);
  local_13b0._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  local_13b0._8_4_ = -fVar68;
  local_13b0._12_4_ = -fVar68;
  auVar83 = ZEXT1664(local_13b0);
  iVar32 = (tray->tnear).field_0.i[k];
  local_13c0._4_4_ = iVar32;
  local_13c0._0_4_ = iVar32;
  local_13c0._8_4_ = iVar32;
  local_13c0._12_4_ = iVar32;
  auVar87 = ZEXT1664(local_13c0);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar32 = 1 << ((uint)k & 0x1f);
  auVar66._4_4_ = iVar32;
  auVar66._0_4_ = iVar32;
  auVar66._8_4_ = iVar32;
  auVar66._12_4_ = iVar32;
  auVar66._16_4_ = iVar32;
  auVar66._20_4_ = iVar32;
  auVar66._24_4_ = iVar32;
  auVar66._28_4_ = iVar32;
  auVar49 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar66 = vpand_avx2(auVar66,auVar49);
  local_1140 = vpcmpeqd_avx2(auVar66,auVar49);
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = &DAT_3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  auVar54._16_4_ = 0x3f800000;
  auVar54._20_4_ = 0x3f800000;
  auVar54._24_4_ = 0x3f800000;
  auVar54._28_4_ = 0x3f800000;
  auVar49._8_4_ = 0xbf800000;
  auVar49._0_8_ = 0xbf800000bf800000;
  auVar49._12_4_ = 0xbf800000;
  auVar49._16_4_ = 0xbf800000;
  auVar49._20_4_ = 0xbf800000;
  auVar49._24_4_ = 0xbf800000;
  auVar49._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar54,auVar49,local_1100);
  do {
    do {
      do {
        if (pauVar40 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar31 = pauVar40 + -1;
        pauVar40 = pauVar40 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar31 + 8));
      uVar43 = *(ulong *)*pauVar40;
      do {
        if ((uVar43 & 8) == 0) {
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar36),auVar75._0_16_,
                                    auVar92._0_16_);
          auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar38),auVar80._0_16_,
                                    auVar67._0_16_);
          auVar48 = vpmaxsd_avx(auVar48,auVar52);
          auVar52 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + uVar39),auVar83._0_16_,
                                    auVar70._0_16_);
          auVar52 = vpmaxsd_avx(auVar52,auVar87._0_16_);
          auVar52 = vpmaxsd_avx(auVar48,auVar52);
          auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar36 ^ 0x10)),
                                    auVar75._0_16_,auVar92._0_16_);
          auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar38 ^ 0x10)),
                                    auVar80._0_16_,auVar67._0_16_);
          auVar48 = vpminsd_avx(auVar48,auVar57);
          auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar43 + 0x20 + (uVar39 ^ 0x10)),
                                    auVar83._0_16_,auVar70._0_16_);
          auVar57 = vpminsd_avx(auVar57,auVar47._0_16_);
          auVar48 = vpminsd_avx(auVar48,auVar57);
          auVar48 = vpcmpgtd_avx(auVar52,auVar48);
          uVar33 = vmovmskps_avx(auVar48);
          unaff_R12 = ((ulong)uVar33 ^ 0xf) & 0xff;
          local_1340._0_16_ = auVar52;
        }
        if ((uVar43 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar32 = 4;
          }
          else {
            uVar42 = uVar43 & 0xfffffffffffffff0;
            lVar41 = 0;
            for (uVar43 = unaff_R12; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              lVar41 = lVar41 + 1;
            }
            iVar32 = 0;
            uVar37 = unaff_R12 - 1 & unaff_R12;
            uVar43 = *(ulong *)(uVar42 + lVar41 * 8);
            if (uVar37 != 0) {
              uVar33 = *(uint *)(local_1340 + lVar41 * 4);
              lVar41 = 0;
              for (uVar18 = uVar37; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar41 = lVar41 + 1;
              }
              uVar37 = uVar37 - 1 & uVar37;
              uVar18 = *(ulong *)(uVar42 + lVar41 * 8);
              uVar34 = *(uint *)(local_1340 + lVar41 * 4);
              if (uVar37 == 0) {
                if (uVar33 < uVar34) {
                  *(ulong *)*pauVar40 = uVar18;
                  *(uint *)(*pauVar40 + 8) = uVar34;
                  pauVar40 = pauVar40 + 1;
                }
                else {
                  *(ulong *)*pauVar40 = uVar43;
                  *(uint *)(*pauVar40 + 8) = uVar33;
                  pauVar40 = pauVar40 + 1;
                  uVar43 = uVar18;
                }
              }
              else {
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar43;
                auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar33));
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar18;
                auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar34));
                lVar41 = 0;
                for (uVar43 = uVar37; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000)
                {
                  lVar41 = lVar41 + 1;
                }
                uVar37 = uVar37 - 1 & uVar37;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = *(ulong *)(uVar42 + lVar41 * 8);
                auVar53 = vpunpcklqdq_avx(auVar57,ZEXT416(*(uint *)(local_1340 + lVar41 * 4)));
                auVar57 = vpcmpgtd_avx(auVar52,auVar48);
                if (uVar37 == 0) {
                  auVar62 = vpshufd_avx(auVar57,0xaa);
                  auVar57 = vblendvps_avx(auVar52,auVar48,auVar62);
                  auVar48 = vblendvps_avx(auVar48,auVar52,auVar62);
                  auVar52 = vpcmpgtd_avx(auVar53,auVar57);
                  auVar62 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar53,auVar57,auVar62);
                  auVar57 = vblendvps_avx(auVar57,auVar53,auVar62);
                  auVar53 = vpcmpgtd_avx(auVar57,auVar48);
                  auVar62 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar57,auVar48,auVar62);
                  auVar48 = vblendvps_avx(auVar48,auVar57,auVar62);
                  *pauVar40 = auVar48;
                  pauVar40[1] = auVar53;
                  uVar43 = auVar52._0_8_;
                  pauVar40 = pauVar40 + 2;
                }
                else {
                  lVar41 = 0;
                  for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                    lVar41 = lVar41 + 1;
                  }
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = *(ulong *)(uVar42 + lVar41 * 8);
                  auVar58 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_1340 + lVar41 * 4)));
                  auVar62 = vpshufd_avx(auVar57,0xaa);
                  auVar57 = vblendvps_avx(auVar52,auVar48,auVar62);
                  auVar48 = vblendvps_avx(auVar48,auVar52,auVar62);
                  auVar52 = vpcmpgtd_avx(auVar58,auVar53);
                  auVar62 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar58,auVar53,auVar62);
                  auVar53 = vblendvps_avx(auVar53,auVar58,auVar62);
                  auVar62 = vpcmpgtd_avx(auVar53,auVar48);
                  auVar58 = vpshufd_avx(auVar62,0xaa);
                  auVar62 = vblendvps_avx(auVar53,auVar48,auVar58);
                  auVar48 = vblendvps_avx(auVar48,auVar53,auVar58);
                  auVar53 = vpcmpgtd_avx(auVar52,auVar57);
                  auVar58 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar52,auVar57,auVar58);
                  auVar52 = vblendvps_avx(auVar57,auVar52,auVar58);
                  auVar57 = vpcmpgtd_avx(auVar62,auVar52);
                  auVar58 = vpshufd_avx(auVar57,0xaa);
                  auVar57 = vblendvps_avx(auVar62,auVar52,auVar58);
                  auVar52 = vblendvps_avx(auVar52,auVar62,auVar58);
                  *pauVar40 = auVar48;
                  pauVar40[1] = auVar52;
                  pauVar40[2] = auVar57;
                  uVar43 = auVar53._0_8_;
                  pauVar40 = pauVar40 + 3;
                }
              }
            }
          }
        }
        else {
          iVar32 = 6;
        }
      } while (iVar32 == 0);
    } while (iVar32 != 6);
    uVar42 = (ulong)((uint)uVar43 & 0xf);
    if (uVar42 != 8) {
      uVar43 = uVar43 & 0xfffffffffffffff0;
      lVar41 = 0;
      do {
        lVar35 = lVar41 * 0xe0;
        lVar1 = uVar43 + 0xd0 + lVar35;
        local_1360 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1358 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar43 + 0xc0 + lVar35;
        local_10e0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        uStack_1350 = local_1360;
        uStack_1348 = uStack_1358;
        auVar59._16_16_ = *(undefined1 (*) [16])(uVar43 + 0x60 + lVar35);
        auVar59._0_16_ = *(undefined1 (*) [16])(uVar43 + lVar35);
        auVar61._16_16_ = *(undefined1 (*) [16])(uVar43 + 0x70 + lVar35);
        auVar61._0_16_ = *(undefined1 (*) [16])(uVar43 + 0x10 + lVar35);
        auVar65._16_16_ = *(undefined1 (*) [16])(uVar43 + 0x80 + lVar35);
        auVar65._0_16_ = *(undefined1 (*) [16])(uVar43 + 0x20 + lVar35);
        auVar48 = *(undefined1 (*) [16])(uVar43 + 0x30 + lVar35);
        auVar44._16_16_ = auVar48;
        auVar44._0_16_ = auVar48;
        auVar52 = *(undefined1 (*) [16])(uVar43 + 0x40 + lVar35);
        auVar50._16_16_ = auVar52;
        auVar50._0_16_ = auVar52;
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0x50 + lVar35);
        auVar55._16_16_ = auVar57;
        auVar55._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0x90 + lVar35);
        auVar63._16_16_ = auVar57;
        auVar63._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0xa0 + lVar35);
        auVar78._16_16_ = auVar57;
        auVar78._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar43 + 0xb0 + lVar35);
        auVar81._16_16_ = auVar57;
        auVar81._0_16_ = auVar57;
        auVar49 = vsubps_avx(auVar59,auVar44);
        auVar66 = vsubps_avx(auVar61,auVar50);
        auVar54 = vsubps_avx(auVar65,auVar55);
        auVar44 = vsubps_avx(auVar63,auVar59);
        auVar14 = vsubps_avx(auVar78,auVar61);
        auVar15 = vsubps_avx(auVar81,auVar65);
        auVar16._4_4_ = auVar66._4_4_ * auVar15._4_4_;
        auVar16._0_4_ = auVar66._0_4_ * auVar15._0_4_;
        auVar16._8_4_ = auVar66._8_4_ * auVar15._8_4_;
        auVar16._12_4_ = auVar66._12_4_ * auVar15._12_4_;
        auVar16._16_4_ = auVar66._16_4_ * auVar15._16_4_;
        auVar16._20_4_ = auVar66._20_4_ * auVar15._20_4_;
        auVar16._24_4_ = auVar66._24_4_ * auVar15._24_4_;
        auVar16._28_4_ = auVar48._12_4_;
        auVar53 = vfmsub231ps_fma(auVar16,auVar14,auVar54);
        auVar17._4_4_ = auVar54._4_4_ * auVar44._4_4_;
        auVar17._0_4_ = auVar54._0_4_ * auVar44._0_4_;
        auVar17._8_4_ = auVar54._8_4_ * auVar44._8_4_;
        auVar17._12_4_ = auVar54._12_4_ * auVar44._12_4_;
        auVar17._16_4_ = auVar54._16_4_ * auVar44._16_4_;
        auVar17._20_4_ = auVar54._20_4_ * auVar44._20_4_;
        auVar17._24_4_ = auVar54._24_4_ * auVar44._24_4_;
        auVar17._28_4_ = auVar52._12_4_;
        auVar62 = vfmsub231ps_fma(auVar17,auVar15,auVar49);
        uVar4 = *(undefined4 *)(ray + k * 4);
        auVar84._4_4_ = uVar4;
        auVar84._0_4_ = uVar4;
        auVar84._8_4_ = uVar4;
        auVar84._12_4_ = uVar4;
        auVar84._16_4_ = uVar4;
        auVar84._20_4_ = uVar4;
        auVar84._24_4_ = uVar4;
        auVar84._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar88._4_4_ = uVar4;
        auVar88._0_4_ = uVar4;
        auVar88._8_4_ = uVar4;
        auVar88._12_4_ = uVar4;
        auVar88._16_4_ = uVar4;
        auVar88._20_4_ = uVar4;
        auVar88._24_4_ = uVar4;
        auVar88._28_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar90._4_4_ = uVar4;
        auVar90._0_4_ = uVar4;
        auVar90._8_4_ = uVar4;
        auVar90._12_4_ = uVar4;
        auVar90._16_4_ = uVar4;
        auVar90._20_4_ = uVar4;
        auVar90._24_4_ = uVar4;
        auVar90._28_4_ = uVar4;
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar79._4_4_ = fVar2;
        auVar79._0_4_ = fVar2;
        auVar79._8_4_ = fVar2;
        auVar79._12_4_ = fVar2;
        auVar79._16_4_ = fVar2;
        auVar79._20_4_ = fVar2;
        auVar79._24_4_ = fVar2;
        auVar79._28_4_ = fVar2;
        auVar16 = vsubps_avx(auVar59,auVar84);
        fVar3 = *(float *)(ray + k * 4 + 0xa0);
        auVar85._4_4_ = fVar3;
        auVar85._0_4_ = fVar3;
        auVar85._8_4_ = fVar3;
        auVar85._12_4_ = fVar3;
        auVar85._16_4_ = fVar3;
        auVar85._20_4_ = fVar3;
        auVar85._24_4_ = fVar3;
        auVar85._28_4_ = fVar3;
        auVar17 = vsubps_avx(auVar61,auVar88);
        fVar68 = *(float *)(ray + k * 4 + 0xc0);
        auVar89._4_4_ = fVar68;
        auVar89._0_4_ = fVar68;
        auVar89._8_4_ = fVar68;
        auVar89._12_4_ = fVar68;
        auVar89._16_4_ = fVar68;
        auVar89._20_4_ = fVar68;
        auVar89._24_4_ = fVar68;
        auVar89._28_4_ = fVar68;
        auVar50 = vsubps_avx(auVar65,auVar90);
        auVar20._4_4_ = fVar2 * auVar17._4_4_;
        auVar20._0_4_ = fVar2 * auVar17._0_4_;
        auVar20._8_4_ = fVar2 * auVar17._8_4_;
        auVar20._12_4_ = fVar2 * auVar17._12_4_;
        auVar20._16_4_ = fVar2 * auVar17._16_4_;
        auVar20._20_4_ = fVar2 * auVar17._20_4_;
        auVar20._24_4_ = fVar2 * auVar17._24_4_;
        auVar20._28_4_ = uVar4;
        auVar48 = vfmsub231ps_fma(auVar20,auVar16,auVar85);
        auVar21._4_4_ = auVar15._4_4_ * auVar48._4_4_;
        auVar21._0_4_ = auVar15._0_4_ * auVar48._0_4_;
        auVar21._8_4_ = auVar15._8_4_ * auVar48._8_4_;
        auVar21._12_4_ = auVar15._12_4_ * auVar48._12_4_;
        auVar21._16_4_ = auVar15._16_4_ * 0.0;
        auVar21._20_4_ = auVar15._20_4_ * 0.0;
        auVar21._24_4_ = auVar15._24_4_ * 0.0;
        auVar21._28_4_ = auVar15._28_4_;
        auVar91._0_4_ = auVar54._0_4_ * auVar48._0_4_;
        auVar91._4_4_ = auVar54._4_4_ * auVar48._4_4_;
        auVar91._8_4_ = auVar54._8_4_ * auVar48._8_4_;
        auVar91._12_4_ = auVar54._12_4_ * auVar48._12_4_;
        auVar91._16_4_ = auVar54._16_4_ * 0.0;
        auVar91._20_4_ = auVar54._20_4_ * 0.0;
        auVar91._24_4_ = auVar54._24_4_ * 0.0;
        auVar91._28_4_ = 0;
        auVar15._4_4_ = fVar68 * auVar16._4_4_;
        auVar15._0_4_ = fVar68 * auVar16._0_4_;
        auVar15._8_4_ = fVar68 * auVar16._8_4_;
        auVar15._12_4_ = fVar68 * auVar16._12_4_;
        auVar15._16_4_ = fVar68 * auVar16._16_4_;
        auVar15._20_4_ = fVar68 * auVar16._20_4_;
        auVar15._24_4_ = fVar68 * auVar16._24_4_;
        auVar15._28_4_ = auVar54._28_4_;
        auVar52 = vfmsub231ps_fma(auVar15,auVar50,auVar79);
        auVar48 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar52),auVar14);
        auVar52 = vfmadd231ps_fma(auVar91,auVar66,ZEXT1632(auVar52));
        auVar22._4_4_ = auVar49._4_4_ * auVar14._4_4_;
        auVar22._0_4_ = auVar49._0_4_ * auVar14._0_4_;
        auVar22._8_4_ = auVar49._8_4_ * auVar14._8_4_;
        auVar22._12_4_ = auVar49._12_4_ * auVar14._12_4_;
        auVar22._16_4_ = auVar49._16_4_ * auVar14._16_4_;
        auVar22._20_4_ = auVar49._20_4_ * auVar14._20_4_;
        auVar22._24_4_ = auVar49._24_4_ * auVar14._24_4_;
        auVar22._28_4_ = auVar14._28_4_;
        auVar58 = vfmsub231ps_fma(auVar22,auVar44,auVar66);
        auVar14._4_4_ = fVar3 * auVar50._4_4_;
        auVar14._0_4_ = fVar3 * auVar50._0_4_;
        auVar14._8_4_ = fVar3 * auVar50._8_4_;
        auVar14._12_4_ = fVar3 * auVar50._12_4_;
        auVar14._16_4_ = fVar3 * auVar50._16_4_;
        auVar14._20_4_ = fVar3 * auVar50._20_4_;
        auVar14._24_4_ = fVar3 * auVar50._24_4_;
        auVar14._28_4_ = auVar66._28_4_;
        auVar19 = vfmsub231ps_fma(auVar14,auVar17,auVar89);
        fVar2 = auVar58._0_4_;
        fVar3 = auVar58._4_4_;
        auVar23._4_4_ = fVar68 * fVar3;
        auVar23._0_4_ = fVar68 * fVar2;
        fVar9 = auVar58._8_4_;
        auVar23._8_4_ = fVar68 * fVar9;
        fVar10 = auVar58._12_4_;
        auVar23._12_4_ = fVar68 * fVar10;
        auVar23._16_4_ = fVar68 * 0.0;
        auVar23._20_4_ = fVar68 * 0.0;
        auVar23._24_4_ = fVar68 * 0.0;
        auVar23._28_4_ = fVar68;
        auVar57 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar62),auVar85);
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),ZEXT1632(auVar53),auVar79);
        auVar74._8_4_ = 0x80000000;
        auVar74._0_8_ = 0x8000000080000000;
        auVar74._12_4_ = 0x80000000;
        auVar74._16_4_ = 0x80000000;
        auVar74._20_4_ = 0x80000000;
        auVar74._24_4_ = 0x80000000;
        auVar74._28_4_ = 0x80000000;
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),ZEXT1632(auVar19),auVar44);
        auVar66 = vandps_avx(ZEXT1632(auVar57),auVar74);
        uVar33 = auVar66._0_4_;
        auVar64._0_4_ = (float)(uVar33 ^ auVar48._0_4_);
        uVar34 = auVar66._4_4_;
        auVar64._4_4_ = (float)(uVar34 ^ auVar48._4_4_);
        uVar76 = auVar66._8_4_;
        auVar64._8_4_ = (float)(uVar76 ^ auVar48._8_4_);
        uVar77 = auVar66._12_4_;
        auVar64._12_4_ = (float)(uVar77 ^ auVar48._12_4_);
        local_1300._16_4_ = auVar66._16_4_;
        auVar64._16_4_ = local_1300._16_4_;
        local_1300._20_4_ = auVar66._20_4_;
        auVar64._20_4_ = local_1300._20_4_;
        local_1300._24_4_ = auVar66._24_4_;
        auVar64._24_4_ = local_1300._24_4_;
        local_1300._28_4_ = auVar66._28_4_;
        auVar64._28_4_ = local_1300._28_4_;
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar49,ZEXT1632(auVar19));
        local_1320._0_4_ = (float)(uVar33 ^ auVar48._0_4_);
        local_1320._4_4_ = (float)(uVar34 ^ auVar48._4_4_);
        local_1320._8_4_ = (float)(uVar76 ^ auVar48._8_4_);
        local_1320._12_4_ = (float)(uVar77 ^ auVar48._12_4_);
        local_1320._16_4_ = local_1300._16_4_;
        local_1320._20_4_ = local_1300._20_4_;
        local_1320._24_4_ = local_1300._24_4_;
        local_1320._28_4_ = local_1300._28_4_;
        auVar66 = vcmpps_avx(auVar64,ZEXT832(0) << 0x20,5);
        auVar49 = vcmpps_avx(local_1320,ZEXT832(0) << 0x20,5);
        auVar66 = vandps_avx(auVar66,auVar49);
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar69._16_4_ = 0x7fffffff;
        auVar69._20_4_ = 0x7fffffff;
        auVar69._24_4_ = 0x7fffffff;
        auVar69._28_4_ = 0x7fffffff;
        local_12e0 = vandps_avx(ZEXT1632(auVar57),auVar69);
        auVar49 = vcmpps_avx(ZEXT1632(auVar57),ZEXT832(0) << 0x20,4);
        auVar66 = vandps_avx(auVar66,auVar49);
        auVar82._0_4_ = auVar64._0_4_ + local_1320._0_4_;
        auVar82._4_4_ = auVar64._4_4_ + local_1320._4_4_;
        auVar82._8_4_ = auVar64._8_4_ + local_1320._8_4_;
        auVar82._12_4_ = auVar64._12_4_ + local_1320._12_4_;
        auVar82._16_4_ = local_1300._16_4_ + local_1300._16_4_;
        auVar82._20_4_ = local_1300._20_4_ + local_1300._20_4_;
        auVar82._24_4_ = local_1300._24_4_ + local_1300._24_4_;
        auVar82._28_4_ = local_1300._28_4_ + local_1300._28_4_;
        auVar49 = vcmpps_avx(auVar82,local_12e0,2);
        auVar54 = auVar49 & auVar66;
        if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar54 >> 0x7f,0) != '\0') ||
              (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar54 >> 0xbf,0) != '\0') ||
            (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar54[0x1f] < '\0') {
          auVar66 = vandps_avx(auVar66,auVar49);
          auVar48 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
          auVar24._4_4_ = fVar3 * auVar50._4_4_;
          auVar24._0_4_ = fVar2 * auVar50._0_4_;
          auVar24._8_4_ = fVar9 * auVar50._8_4_;
          auVar24._12_4_ = fVar10 * auVar50._12_4_;
          auVar24._16_4_ = auVar50._16_4_ * 0.0;
          auVar24._20_4_ = auVar50._20_4_ * 0.0;
          auVar24._24_4_ = auVar50._24_4_ * 0.0;
          auVar24._28_4_ = auVar50._28_4_;
          auVar52 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar62),auVar24);
          auVar52 = vfmadd213ps_fma(auVar16,ZEXT1632(auVar53),ZEXT1632(auVar52));
          local_1300._0_4_ = (float)(uVar33 ^ auVar52._0_4_);
          local_1300._4_4_ = (float)(uVar34 ^ auVar52._4_4_);
          local_1300._8_4_ = (float)(uVar76 ^ auVar52._8_4_);
          local_1300._12_4_ = (float)(uVar77 ^ auVar52._12_4_);
          fVar68 = *(float *)(ray + k * 4 + 0x60);
          auVar25._4_4_ = local_12e0._4_4_ * fVar68;
          auVar25._0_4_ = local_12e0._0_4_ * fVar68;
          auVar25._8_4_ = local_12e0._8_4_ * fVar68;
          auVar25._12_4_ = local_12e0._12_4_ * fVar68;
          auVar25._16_4_ = local_12e0._16_4_ * fVar68;
          auVar25._20_4_ = local_12e0._20_4_ * fVar68;
          auVar25._24_4_ = local_12e0._24_4_ * fVar68;
          auVar25._28_4_ = fVar68;
          auVar66 = vcmpps_avx(auVar25,local_1300,1);
          fVar68 = *(float *)(ray + k * 4 + 0x100);
          auVar26._4_4_ = local_12e0._4_4_ * fVar68;
          auVar26._0_4_ = local_12e0._0_4_ * fVar68;
          auVar26._8_4_ = local_12e0._8_4_ * fVar68;
          auVar26._12_4_ = local_12e0._12_4_ * fVar68;
          auVar26._16_4_ = local_12e0._16_4_ * fVar68;
          auVar26._20_4_ = local_12e0._20_4_ * fVar68;
          auVar26._24_4_ = local_12e0._24_4_ * fVar68;
          auVar26._28_4_ = fVar68;
          auVar49 = vcmpps_avx(local_1300,auVar26,2);
          auVar66 = vandps_avx(auVar66,auVar49);
          auVar52 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
          auVar48 = vpand_avx(auVar48,auVar52);
          auVar66 = vpmovzxwd_avx2(auVar48);
          auVar66 = vpslld_avx2(auVar66,0x1f);
          if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0x7f,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0xbf,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar66[0x1f] < '\0') {
            local_1420 = vpsrad_avx2(auVar66,0x1f);
            local_1340 = auVar64;
            local_12c0 = ZEXT1632(auVar53);
            local_12a0 = ZEXT1632(auVar62);
            local_1280 = ZEXT1632(auVar58);
            local_1260 = local_1420;
            local_1180 = local_1100;
            pSVar6 = context->scene;
            auVar49 = vrcpps_avx(local_12e0);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = &DAT_3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar86._16_4_ = 0x3f800000;
            auVar86._20_4_ = 0x3f800000;
            auVar86._24_4_ = 0x3f800000;
            auVar86._28_4_ = 0x3f800000;
            auVar52 = vfnmadd213ps_fma(local_12e0,auVar49,auVar86);
            auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar49,auVar49);
            fVar68 = auVar52._0_4_;
            fVar71 = auVar52._4_4_;
            local_1200._4_4_ = fVar71 * local_1300._4_4_;
            local_1200._0_4_ = fVar68 * local_1300._0_4_;
            fVar72 = auVar52._8_4_;
            local_1200._8_4_ = fVar72 * local_1300._8_4_;
            fVar73 = auVar52._12_4_;
            local_1200._12_4_ = fVar73 * local_1300._12_4_;
            local_1200._16_4_ = local_1300._16_4_ * 0.0;
            local_1200._20_4_ = local_1300._20_4_ * 0.0;
            local_1200._24_4_ = local_1300._24_4_ * 0.0;
            local_1200._28_4_ = auVar49._28_4_;
            auVar47 = ZEXT3264(local_1200);
            auVar27._4_4_ = fVar71 * auVar64._4_4_;
            auVar27._0_4_ = fVar68 * auVar64._0_4_;
            auVar27._8_4_ = fVar72 * auVar64._8_4_;
            auVar27._12_4_ = fVar73 * auVar64._12_4_;
            auVar27._16_4_ = local_1300._16_4_ * 0.0;
            auVar27._20_4_ = local_1300._20_4_ * 0.0;
            auVar27._24_4_ = local_1300._24_4_ * 0.0;
            auVar27._28_4_ = local_1300._28_4_;
            auVar49 = vminps_avx(auVar27,auVar86);
            auVar28._4_4_ = fVar71 * local_1320._4_4_;
            auVar28._0_4_ = fVar68 * local_1320._0_4_;
            auVar28._8_4_ = fVar72 * local_1320._8_4_;
            auVar28._12_4_ = fVar73 * local_1320._12_4_;
            auVar28._16_4_ = local_1300._16_4_ * 0.0;
            auVar28._20_4_ = local_1300._20_4_ * 0.0;
            auVar28._24_4_ = local_1300._24_4_ * 0.0;
            auVar28._28_4_ = local_1300._28_4_;
            auVar54 = vminps_avx(auVar28,auVar86);
            auVar44 = vsubps_avx(auVar86,auVar49);
            auVar14 = vsubps_avx(auVar86,auVar54);
            local_1220 = vblendvps_avx(auVar54,auVar44,local_1100);
            local_1240 = vblendvps_avx(auVar49,auVar14,local_1100);
            fVar68 = local_1120._0_4_;
            local_11e0._0_4_ = auVar53._0_4_ * fVar68;
            fVar71 = local_1120._4_4_;
            local_11e0._4_4_ = auVar53._4_4_ * fVar71;
            fVar72 = local_1120._8_4_;
            local_11e0._8_4_ = auVar53._8_4_ * fVar72;
            fVar73 = local_1120._12_4_;
            local_11e0._12_4_ = auVar53._12_4_ * fVar73;
            fVar11 = local_1120._16_4_;
            local_11e0._16_4_ = fVar11 * 0.0;
            fVar12 = local_1120._20_4_;
            local_11e0._20_4_ = fVar12 * 0.0;
            fVar13 = local_1120._24_4_;
            local_11e0._24_4_ = fVar13 * 0.0;
            local_11e0._28_4_ = 0;
            local_11c0._0_4_ = fVar68 * auVar62._0_4_;
            local_11c0._4_4_ = fVar71 * auVar62._4_4_;
            local_11c0._8_4_ = fVar72 * auVar62._8_4_;
            local_11c0._12_4_ = fVar73 * auVar62._12_4_;
            local_11c0._16_4_ = fVar11 * 0.0;
            local_11c0._20_4_ = fVar12 * 0.0;
            local_11c0._24_4_ = fVar13 * 0.0;
            local_11c0._28_4_ = 0;
            local_11a0._0_4_ = fVar68 * fVar2;
            local_11a0._4_4_ = fVar71 * fVar3;
            local_11a0._8_4_ = fVar72 * fVar9;
            local_11a0._12_4_ = fVar73 * fVar10;
            local_11a0._16_4_ = fVar11 * 0.0;
            local_11a0._20_4_ = fVar12 * 0.0;
            local_11a0._24_4_ = fVar13 * 0.0;
            local_11a0._28_4_ = 0;
            auVar45._8_4_ = 0x7f800000;
            auVar45._0_8_ = 0x7f8000007f800000;
            auVar45._12_4_ = 0x7f800000;
            auVar45._16_4_ = 0x7f800000;
            auVar45._20_4_ = 0x7f800000;
            auVar45._24_4_ = 0x7f800000;
            auVar45._28_4_ = 0x7f800000;
            auVar66 = vblendvps_avx(auVar45,local_1200,auVar66);
            auVar49 = vshufps_avx(auVar66,auVar66,0xb1);
            auVar49 = vminps_avx(auVar66,auVar49);
            auVar54 = vshufpd_avx(auVar49,auVar49,5);
            auVar49 = vminps_avx(auVar49,auVar54);
            auVar54 = vpermpd_avx2(auVar49,0x4e);
            auVar49 = vminps_avx(auVar49,auVar54);
            auVar66 = vcmpps_avx(auVar66,auVar49,0);
            auVar52 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
            auVar48 = vpand_avx(auVar52,auVar48);
            auVar66 = vpmovzxwd_avx2(auVar48);
            auVar66 = vpslld_avx2(auVar66,0x1f);
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0x7f,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar66 >> 0xbf,0) == '\0') &&
                (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar66[0x1f]) {
              auVar66 = local_1420;
            }
            uVar34 = vmovmskps_avx(auVar66);
            uVar33 = 0;
            for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
              uVar33 = uVar33 + 1;
            }
            do {
              local_13d0 = auVar92._0_16_;
              uVar37 = (ulong)uVar33;
              uVar33 = *(uint *)((long)&local_10e0 + uVar37 * 4);
              pGVar7 = (pSVar6->geometries).items[uVar33].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1420 + uVar37 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar4 = *(undefined4 *)(local_1240 + uVar37 * 4);
                  uVar5 = *(undefined4 *)(local_1220 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11e0 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11c0 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11a0 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1360 + uVar37 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar33;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1160 = auVar47._0_32_;
                uVar4 = *(undefined4 *)(local_1240 + uVar37 * 4);
                local_1060._4_4_ = uVar4;
                local_1060._0_4_ = uVar4;
                local_1060._8_4_ = uVar4;
                local_1060._12_4_ = uVar4;
                local_1060._16_4_ = uVar4;
                local_1060._20_4_ = uVar4;
                local_1060._24_4_ = uVar4;
                local_1060._28_4_ = uVar4;
                local_1040 = *(undefined4 *)(local_1220 + uVar37 * 4);
                uVar4 = *(undefined4 *)((long)&local_1360 + uVar37 * 4);
                auVar58._4_4_ = uVar4;
                auVar58._0_4_ = uVar4;
                auVar58._8_4_ = uVar4;
                auVar58._12_4_ = uVar4;
                auVar60._16_4_ = uVar4;
                auVar60._0_16_ = auVar58;
                auVar60._20_4_ = uVar4;
                auVar60._24_4_ = uVar4;
                auVar60._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_11e0 + uVar37 * 4);
                uVar5 = *(undefined4 *)(local_11c0 + uVar37 * 4);
                local_10a0._4_4_ = uVar5;
                local_10a0._0_4_ = uVar5;
                local_10a0._8_4_ = uVar5;
                local_10a0._12_4_ = uVar5;
                local_10a0._16_4_ = uVar5;
                local_10a0._20_4_ = uVar5;
                local_10a0._24_4_ = uVar5;
                local_10a0._28_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_11a0 + uVar37 * 4);
                local_1080._4_4_ = uVar5;
                local_1080._0_4_ = uVar5;
                local_1080._8_4_ = uVar5;
                local_1080._12_4_ = uVar5;
                local_1080._16_4_ = uVar5;
                local_1080._20_4_ = uVar5;
                local_1080._24_4_ = uVar5;
                local_1080._28_4_ = uVar5;
                auVar53._4_4_ = uVar33;
                auVar53._0_4_ = uVar33;
                auVar53._8_4_ = uVar33;
                auVar53._12_4_ = uVar33;
                auVar56._16_4_ = uVar33;
                auVar56._0_16_ = auVar53;
                auVar56._20_4_ = uVar33;
                auVar56._24_4_ = uVar33;
                auVar56._28_4_ = uVar33;
                local_10c0[0] = (RTCHitN)(char)uVar4;
                local_10c0[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[4] = (RTCHitN)(char)uVar4;
                local_10c0[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[8] = (RTCHitN)(char)uVar4;
                local_10c0[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0xc] = (RTCHitN)(char)uVar4;
                local_10c0[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x10] = (RTCHitN)(char)uVar4;
                local_10c0[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)uVar4;
                local_10c0[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)uVar4;
                local_10c0[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)uVar4;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                local_1020 = auVar60;
                local_1000 = auVar56;
                vpcmpeqd_avx2(local_1060,local_1060);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar37 * 4);
                local_1400 = local_1140._0_8_;
                uStack_13f8 = local_1140._8_8_;
                uStack_13f0 = local_1140._16_8_;
                uStack_13e8 = local_1140._24_8_;
                local_1450.valid = (int *)&local_1400;
                local_1450.geometryUserPtr = pGVar7->userPtr;
                local_1450.context = context->user;
                local_1450.hit = local_10c0;
                local_1450.N = 8;
                local_1450.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar56 = ZEXT1632(auVar53);
                  auVar60 = ZEXT1632(auVar58);
                  (*pGVar7->intersectionFilterN)(&local_1450);
                }
                auVar29._8_8_ = uStack_13f8;
                auVar29._0_8_ = local_1400;
                auVar29._16_8_ = uStack_13f0;
                auVar29._24_8_ = uStack_13e8;
                auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar29);
                auVar66 = _DAT_0205a980 & ~auVar49;
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar66[0x1f]) {
                  auVar47 = ZEXT3264(auVar49 ^ _DAT_0205a980);
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar56 = ZEXT1632(auVar56._0_16_);
                    auVar60 = ZEXT1632(auVar60._0_16_);
                    (*p_Var8)(&local_1450);
                  }
                  auVar30._8_8_ = uStack_13f8;
                  auVar30._0_8_ = local_1400;
                  auVar30._16_8_ = uStack_13f0;
                  auVar30._24_8_ = uStack_13e8;
                  auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30);
                  auVar66 = vpcmpeqd_avx2(auVar60,auVar60);
                  auVar47 = ZEXT3264(auVar49 ^ auVar66);
                  auVar54 = vpcmpeqd_avx2(auVar56,auVar56);
                  auVar66 = auVar66 & ~auVar49;
                  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar66 >> 0x7f,0) != '\0') ||
                        (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar66 >> 0xbf,0) != '\0') ||
                      (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar66[0x1f] < '\0') {
                    auVar49 = auVar49 ^ auVar54;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])local_1450.hit);
                    *(undefined1 (*) [32])(local_1450.ray + 0x180) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0x20));
                    *(undefined1 (*) [32])(local_1450.ray + 0x1a0) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0x40));
                    *(undefined1 (*) [32])(local_1450.ray + 0x1c0) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0x60));
                    *(undefined1 (*) [32])(local_1450.ray + 0x1e0) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0x80));
                    *(undefined1 (*) [32])(local_1450.ray + 0x200) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_1450.ray + 0x220) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_1450.ray + 0x240) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_1450.ray + 0x260) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_1450.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_1450.ray + 0x280) = auVar66;
                  }
                }
                auVar66 = auVar47._0_32_;
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar47 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar47 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar47[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                }
                *(undefined4 *)(local_1420 + uVar37 * 4) = 0;
                uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar46._4_4_ = uVar4;
                auVar46._0_4_ = uVar4;
                auVar46._8_4_ = uVar4;
                auVar46._12_4_ = uVar4;
                auVar46._16_4_ = uVar4;
                auVar46._20_4_ = uVar4;
                auVar46._24_4_ = uVar4;
                auVar46._28_4_ = uVar4;
                auVar47 = ZEXT3264(local_1160);
                auVar66 = vcmpps_avx(local_1160,auVar46,2);
                local_1420 = vandps_avx(auVar66,local_1420);
                auVar92 = ZEXT1664(local_13d0);
              }
              if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1420 >> 0x7f,0) == '\0') &&
                    (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1420 >> 0xbf,0) == '\0') &&
                  (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1420[0x1f]) break;
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar51._16_4_ = 0x7f800000;
              auVar51._20_4_ = 0x7f800000;
              auVar51._24_4_ = 0x7f800000;
              auVar51._28_4_ = 0x7f800000;
              auVar66 = vblendvps_avx(auVar51,auVar47._0_32_,local_1420);
              auVar49 = vshufps_avx(auVar66,auVar66,0xb1);
              auVar49 = vminps_avx(auVar66,auVar49);
              auVar54 = vshufpd_avx(auVar49,auVar49,5);
              auVar49 = vminps_avx(auVar49,auVar54);
              auVar54 = vpermpd_avx2(auVar49,0x4e);
              auVar49 = vminps_avx(auVar49,auVar54);
              auVar49 = vcmpps_avx(auVar66,auVar49,0);
              auVar54 = local_1420 & auVar49;
              auVar66 = local_1420;
              if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar54 >> 0x7f,0) != '\0') ||
                    (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar54 >> 0xbf,0) != '\0') ||
                  (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar54[0x1f] < '\0') {
                auVar66 = vandps_avx(auVar49,local_1420);
              }
              uVar34 = vmovmskps_avx(auVar66);
              uVar33 = 0;
              for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
                uVar33 = uVar33 + 1;
              }
            } while( true );
          }
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != uVar42 - 8);
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar47 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
    auVar67 = ZEXT1664(local_1370);
    auVar70 = ZEXT1664(local_1380);
    auVar75 = ZEXT1664(local_1390);
    auVar80 = ZEXT1664(local_13a0);
    auVar83 = ZEXT1664(local_13b0);
    auVar87 = ZEXT1664(local_13c0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }